

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O2

void __thiscall Block::toString(Block *this)

{
  Record *pRVar1;
  ostream *poVar2;
  Record *pRVar3;
  undefined1 local_58 [8];
  Record r;
  
  pRVar1 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->records).super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    Record::Record((Record *)local_58,pRVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_58);
    std::operator<<(poVar2," ,");
    std::__cxx11::string::~string((string *)local_58);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Block::toString() {
    for (Record r : records) {
        std::cout << r.tconst << " ,";
    }
    std::cout << std::endl;
}